

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pdqsort.h
# Opt level: O1

pair<__gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>,_bool>
pdqsort_detail::
partition_right_branchless<__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>,std::less<int>>
          (int *begin,int *end)

{
  int *piVar1;
  byte *pbVar2;
  byte *pbVar3;
  byte bVar4;
  int iVar5;
  int iVar6;
  char cVar7;
  long lVar8;
  ulong uVar9;
  ulong uVar10;
  int __tmp;
  ulong uVar11;
  int *piVar12;
  int *piVar13;
  int *piVar14;
  long lVar15;
  int *piVar16;
  ulong uVar17;
  ulong uVar18;
  int *piVar19;
  pair<__gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>,_bool> pVar20;
  uchar offsets_l_storage [128];
  long local_178;
  long local_170;
  byte abStack_101 [128];
  byte abStack_81 [81];
  
  iVar5 = *begin;
  lVar8 = 0;
  do {
    iVar6 = *(int *)((long)begin + lVar8 + 4);
    lVar8 = lVar8 + 4;
  } while (iVar6 < iVar5);
  piVar1 = (int *)((long)begin + lVar8);
  piVar16 = end;
  if (lVar8 == 4) {
    do {
      if (end <= piVar1) break;
      piVar16 = end + -1;
      piVar14 = end + -1;
      end = piVar16;
    } while (iVar5 <= *piVar14);
  }
  else {
    do {
      end = piVar16 + -1;
      piVar14 = piVar16 + -1;
      piVar16 = end;
    } while (iVar5 <= *piVar14);
  }
  piVar16 = piVar1;
  if (piVar1 < end) {
    piVar16 = (int *)((long)begin + lVar8) + 1;
    *(int *)((long)begin + lVar8) = *end;
    *end = iVar6;
    piVar13 = end;
    piVar14 = end;
    piVar19 = piVar16;
    if (piVar16 < end) {
      local_178 = 0;
      local_170 = 0;
      uVar18 = 0;
      uVar9 = 0;
      do {
        uVar17 = (long)piVar14 - (long)piVar16 >> 2;
        uVar11 = uVar17 >> (uVar18 == 0);
        if (uVar9 != 0) {
          uVar11 = 0;
        }
        uVar17 = uVar17 - uVar11;
        if (uVar18 != 0) {
          uVar17 = 0;
        }
        if (uVar11 < 0x40) {
          uVar10 = uVar9;
          if (uVar11 != 0) {
            lVar8 = 0;
            uVar10 = 0;
            do {
              abStack_81[uVar9 + 1] = (byte)uVar10;
              piVar12 = piVar16 + uVar10;
              uVar10 = uVar10 + 1;
              uVar9 = (iVar5 <= *piVar12) + uVar9;
              lVar8 = lVar8 + -4;
            } while (uVar11 != uVar10);
            piVar16 = (int *)((long)piVar16 - lVar8);
            uVar10 = uVar9;
          }
        }
        else {
          lVar8 = 0;
          uVar11 = 0xfffffffffffffff8;
          do {
            uVar10 = uVar11 + 8;
            abStack_81[uVar9 + 1] = (byte)uVar10;
            lVar15 = (iVar5 <= piVar16[uVar11 + 8]) + uVar9;
            cVar7 = (char)uVar11;
            abStack_81[lVar15 + 1] = cVar7 + 9;
            lVar15 = (ulong)(iVar5 <= piVar16[uVar11 + 9]) + lVar15;
            abStack_81[lVar15 + 1] = cVar7 + 10;
            lVar15 = (ulong)(iVar5 <= piVar16[uVar11 + 10]) + lVar15;
            abStack_81[lVar15 + 1] = cVar7 + 0xb;
            lVar15 = (ulong)(iVar5 <= piVar16[uVar11 + 0xb]) + lVar15;
            abStack_81[lVar15 + 1] = cVar7 + 0xc;
            lVar15 = (ulong)(iVar5 <= piVar16[uVar11 + 0xc]) + lVar15;
            abStack_81[lVar15 + 1] = cVar7 + 0xd;
            lVar15 = (ulong)(iVar5 <= piVar16[uVar11 + 0xd]) + lVar15;
            abStack_81[lVar15 + 1] = cVar7 + 0xe;
            lVar15 = (ulong)(iVar5 <= piVar16[uVar11 + 0xe]) + lVar15;
            abStack_81[lVar15 + 1] = cVar7 + 0xf;
            uVar9 = (ulong)(iVar5 <= piVar16[uVar11 + 0xf]) + lVar15;
            lVar8 = lVar8 + 0x20;
            uVar11 = uVar10;
          } while (uVar10 < 0x38);
          piVar16 = (int *)((long)piVar16 + lVar8);
          uVar10 = uVar9;
        }
        if (uVar17 < 0x40) {
          if (uVar17 != 0) {
            uVar9 = 0;
            piVar12 = piVar14;
            do {
              uVar9 = uVar9 + 1;
              abStack_101[uVar18 + 1] = (byte)uVar9;
              piVar14 = piVar12 + -1;
              uVar18 = uVar18 + (piVar12[-1] < iVar5);
              piVar12 = piVar14;
            } while (uVar17 != uVar9);
          }
        }
        else {
          uVar9 = 0xfffffffffffffff8;
          piVar12 = piVar14;
          do {
            cVar7 = (char)uVar9;
            abStack_101[uVar18 + 1] = cVar7 + 9;
            lVar8 = (piVar12[-1] < iVar5) + uVar18;
            abStack_101[lVar8 + 1] = cVar7 + 10;
            lVar8 = (ulong)(piVar12[-2] < iVar5) + lVar8;
            abStack_101[lVar8 + 1] = cVar7 + 0xb;
            lVar8 = (ulong)(piVar12[-3] < iVar5) + lVar8;
            abStack_101[lVar8 + 1] = cVar7 + 0xc;
            lVar8 = (ulong)(piVar12[-4] < iVar5) + lVar8;
            abStack_101[lVar8 + 1] = cVar7 + 0xd;
            lVar8 = (ulong)(piVar12[-5] < iVar5) + lVar8;
            abStack_101[lVar8 + 1] = cVar7 + 0xe;
            lVar8 = (ulong)(piVar12[-6] < iVar5) + lVar8;
            abStack_101[lVar8 + 1] = cVar7 + 0xf;
            lVar8 = (ulong)(piVar12[-7] < iVar5) + lVar8;
            abStack_101[lVar8 + 1] = cVar7 + 0x10;
            piVar14 = piVar12 + -8;
            uVar18 = (ulong)(piVar12[-8] < iVar5) + lVar8;
            uVar9 = uVar9 + 8;
            piVar12 = piVar14;
          } while (uVar9 < 0x38);
        }
        uVar11 = uVar10;
        if (uVar18 < uVar10) {
          uVar11 = uVar18;
        }
        pbVar2 = abStack_81 + local_178 + 1;
        pbVar3 = abStack_101 + local_170 + 1;
        if (uVar10 == uVar18) {
          if (uVar11 != 0) {
            uVar9 = 0;
            do {
              bVar4 = pbVar3[uVar9];
              iVar6 = piVar19[pbVar2[uVar9]];
              piVar19[pbVar2[uVar9]] = piVar13[-(ulong)bVar4];
              piVar13[-(ulong)bVar4] = iVar6;
              uVar9 = uVar9 + 1;
            } while (uVar11 != uVar9);
          }
        }
        else if (uVar11 != 0) {
          piVar12 = piVar13 + -(ulong)*pbVar3;
          iVar6 = piVar19[*pbVar2];
          piVar19[*pbVar2] = *piVar12;
          if (uVar11 != 1) {
            uVar9 = 1;
            do {
              bVar4 = pbVar2[uVar9];
              *piVar12 = piVar19[bVar4];
              piVar12 = piVar13 + -(ulong)pbVar3[uVar9];
              piVar19[bVar4] = *piVar12;
              uVar9 = uVar9 + 1;
            } while (uVar11 != uVar9);
          }
          *piVar12 = iVar6;
        }
        uVar9 = uVar10 - uVar11;
        local_178 = local_178 + uVar11;
        if (uVar10 <= uVar18) {
          local_178 = 0;
          piVar19 = piVar16;
        }
        uVar18 = uVar18 - uVar11;
        local_170 = local_170 + uVar11;
        if (uVar18 == 0) {
          local_170 = 0;
          piVar13 = piVar14;
        }
      } while (piVar16 < piVar14);
    }
    else {
      uVar9 = 0;
      uVar18 = 0;
      local_170 = 0;
      local_178 = 0;
    }
    for (; uVar9 != 0; uVar9 = uVar9 - 1) {
      piVar16 = piVar14 + -1;
      iVar6 = piVar19[abStack_81[uVar9 + local_178]];
      piVar19[abStack_81[uVar9 + local_178]] = piVar14[-1];
      piVar14[-1] = iVar6;
      piVar14 = piVar16;
    }
    for (; uVar18 != 0; uVar18 = uVar18 - 1) {
      iVar6 = piVar13[-(ulong)abStack_101[uVar18 + local_170]];
      piVar13[-(ulong)abStack_101[uVar18 + local_170]] = *piVar16;
      *piVar16 = iVar6;
      piVar16 = piVar16 + 1;
    }
  }
  pVar20._9_7_ = (undefined7)((ulong)piVar1 >> 8);
  pVar20.second = end <= piVar1;
  *begin = piVar16[-1];
  piVar16[-1] = iVar5;
  pVar20.first._M_current = piVar16 + -1;
  return pVar20;
}

Assistant:

inline std::pair<Iter, bool> partition_right_branchless(Iter begin, Iter end, Compare comp) {
        typedef typename std::iterator_traits<Iter>::value_type T;

        // Move pivot into local for speed.
        T pivot(PDQSORT_PREFER_MOVE(*begin));
        Iter first = begin;
        Iter last = end;

        // Find the first element greater than or equal than the pivot (the median of 3 guarantees
        // this exists).
        while (comp(*++first, pivot));

        // Find the first element strictly smaller than the pivot. We have to guard this search if
        // there was no element before *first.
        if (first - 1 == begin) while (first < last && !comp(*--last, pivot));
        else                    while (                !comp(*--last, pivot));

        // If the first pair of elements that should be swapped to partition are the same element,
        // the passed in sequence already was correctly partitioned.
        bool already_partitioned = first >= last;
        if (!already_partitioned) {
            std::iter_swap(first, last);
            ++first;

            // The following branchless partitioning is derived from "BlockQuicksort: How Branch
            // Mispredictions don’t affect Quicksort" by Stefan Edelkamp and Armin Weiss, but
            // heavily micro-optimized.
            unsigned char offsets_l_storage[block_size + cacheline_size];
            unsigned char offsets_r_storage[block_size + cacheline_size];
            unsigned char* offsets_l = align_cacheline(offsets_l_storage);
            unsigned char* offsets_r = align_cacheline(offsets_r_storage);

            Iter offsets_l_base = first;
            Iter offsets_r_base = last;
            size_t num_l, num_r, start_l, start_r;
            num_l = num_r = start_l = start_r = 0;
            
            while (first < last) {
                // Fill up offset blocks with elements that are on the wrong side.
                // First we determine how much elements are considered for each offset block.
                size_t num_unknown = last - first;
                size_t left_split = num_l == 0 ? (num_r == 0 ? num_unknown / 2 : num_unknown) : 0;
                size_t right_split = num_r == 0 ? (num_unknown - left_split) : 0;

                // Fill the offset blocks.
                if (left_split >= block_size) {
                    for (size_t i = 0; i < block_size;) {
                        offsets_l[num_l] = i++; num_l += !comp(*first, pivot); ++first;
                        offsets_l[num_l] = i++; num_l += !comp(*first, pivot); ++first;
                        offsets_l[num_l] = i++; num_l += !comp(*first, pivot); ++first;
                        offsets_l[num_l] = i++; num_l += !comp(*first, pivot); ++first;
                        offsets_l[num_l] = i++; num_l += !comp(*first, pivot); ++first;
                        offsets_l[num_l] = i++; num_l += !comp(*first, pivot); ++first;
                        offsets_l[num_l] = i++; num_l += !comp(*first, pivot); ++first;
                        offsets_l[num_l] = i++; num_l += !comp(*first, pivot); ++first;
                    }
                } else {
                    for (size_t i = 0; i < left_split;) {
                        offsets_l[num_l] = i++; num_l += !comp(*first, pivot); ++first;
                    }
                }

                if (right_split >= block_size) {
                    for (size_t i = 0; i < block_size;) {
                        offsets_r[num_r] = ++i; num_r += comp(*--last, pivot);
                        offsets_r[num_r] = ++i; num_r += comp(*--last, pivot);
                        offsets_r[num_r] = ++i; num_r += comp(*--last, pivot);
                        offsets_r[num_r] = ++i; num_r += comp(*--last, pivot);
                        offsets_r[num_r] = ++i; num_r += comp(*--last, pivot);
                        offsets_r[num_r] = ++i; num_r += comp(*--last, pivot);
                        offsets_r[num_r] = ++i; num_r += comp(*--last, pivot);
                        offsets_r[num_r] = ++i; num_r += comp(*--last, pivot);
                    }
                } else {
                    for (size_t i = 0; i < right_split;) {
                        offsets_r[num_r] = ++i; num_r += comp(*--last, pivot);
                    }
                }

                // Swap elements and update block sizes and first/last boundaries.
                size_t num = std::min(num_l, num_r);
                swap_offsets(offsets_l_base, offsets_r_base,
                             offsets_l + start_l, offsets_r + start_r,
                             num, num_l == num_r);
                num_l -= num; num_r -= num;
                start_l += num; start_r += num;

                if (num_l == 0) {
                    start_l = 0;
                    offsets_l_base = first;
                }
                
                if (num_r == 0) {
                    start_r = 0;
                    offsets_r_base = last;
                }
            }

            // We have now fully identified [first, last)'s proper position. Swap the last elements.
            if (num_l) {
                offsets_l += start_l;
                while (num_l--) std::iter_swap(offsets_l_base + offsets_l[num_l], --last);
                first = last;
            }
            if (num_r) {
                offsets_r += start_r;
                while (num_r--) std::iter_swap(offsets_r_base - offsets_r[num_r], first), ++first;
                last = first;
            }
        }

        // Put the pivot in the right place.
        Iter pivot_pos = first - 1;
        *begin = PDQSORT_PREFER_MOVE(*pivot_pos);
        *pivot_pos = PDQSORT_PREFER_MOVE(pivot);

        return std::make_pair(pivot_pos, already_partitioned);
    }